

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O0

void __thiscall OpenMD::COHZ::computeFrame(COHZ *this,int frame)

{
  double *pdVar1;
  long in_RDI;
  Mat3x3d hmat;
  int in_stack_000001ac;
  TimeCorrFunc<OpenMD::Vector<double,_4U>_> *in_stack_000001b0;
  Snapshot *in_stack_ffffffffffffff78;
  RectMatrix<double,_3U,_3U> local_58;
  
  Snapshot::getHmat(in_stack_ffffffffffffff78);
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                     (&local_58,*(uint *)(in_RDI + 0xe88),*(uint *)(in_RDI + 0xe88));
  *(double *)(in_RDI + 0xe78) = *pdVar1;
  *(double *)(in_RDI + 0xe80) = *(double *)(in_RDI + 0xe78) * 0.5;
  TimeCorrFunc<OpenMD::Vector<double,_4U>_>::computeFrame(in_stack_000001b0,in_stack_000001ac);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16e0fb);
  return;
}

Assistant:

void COHZ::computeFrame(int frame) {
    Mat3x3d hmat = currentSnapshot_->getHmat();
    boxZ_        = hmat(axis_, axis_);
    halfBoxZ_    = boxZ_ / 2.0;

    MoleculeACF<Vector<RealType, 4>>::computeFrame(frame);
  }